

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::assign_impl
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,size_type count,long *value)

{
  long *plVar1;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RDX;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RSI;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RDI;
  size_type i;
  size_t in_stack_ffffffffffffffe0;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this_00;
  
  plVar1 = choose_data(in_RDX,in_stack_ffffffffffffffe0);
  in_RDI->m_end = plVar1;
  in_RDI->m_begin = plVar1;
  for (this_00 = (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *)0x0; this_00 < in_RSI;
      this_00 = (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *)&this_00->field_0x1) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<long>>::construct<long,long_const&>
              ((allocator_type *)this_00,(long *)in_RDI,(long *)0x184108);
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  update_capacity(this_00);
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }